

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::MergeFrom(FileOptions *this,FileOptions *from)

{
  uint uVar1;
  void *pvVar2;
  
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(from->uninterpreted_option_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      _internal_set_java_package(this,(from->java_package_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      _internal_set_java_outer_classname(this,(from->java_outer_classname_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      _internal_set_go_package(this,(from->go_package_).ptr_);
    }
    if ((uVar1 & 8) != 0) {
      _internal_set_objc_class_prefix(this,(from->objc_class_prefix_).ptr_);
    }
    if ((uVar1 & 0x10) != 0) {
      _internal_set_csharp_namespace(this,(from->csharp_namespace_).ptr_);
    }
    if ((uVar1 & 0x20) != 0) {
      _internal_set_swift_prefix(this,(from->swift_prefix_).ptr_);
    }
    if ((uVar1 & 0x40) != 0) {
      _internal_set_php_class_prefix(this,(from->php_class_prefix_).ptr_);
    }
    if ((char)uVar1 < '\0') {
      _internal_set_php_namespace(this,(from->php_namespace_).ptr_);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      _internal_set_php_metadata_namespace(this,(from->php_metadata_namespace_).ptr_);
    }
    if ((uVar1 >> 9 & 1) != 0) {
      _internal_set_ruby_package(this,(from->ruby_package_).ptr_);
    }
    if ((uVar1 >> 10 & 1) != 0) {
      this->java_multiple_files_ = from->java_multiple_files_;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      this->java_generate_equals_and_hash_ = from->java_generate_equals_and_hash_;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      this->java_string_check_utf8_ = from->java_string_check_utf8_;
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      this->cc_generic_services_ = from->cc_generic_services_;
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      this->java_generic_services_ = from->java_generic_services_;
    }
    if ((short)uVar1 < 0) {
      this->py_generic_services_ = from->py_generic_services_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  if ((uVar1 & 0xf0000) != 0) {
    if ((uVar1 >> 0x10 & 1) != 0) {
      this->php_generic_services_ = from->php_generic_services_;
    }
    if ((uVar1 >> 0x11 & 1) != 0) {
      this->deprecated_ = from->deprecated_;
    }
    if ((uVar1 >> 0x12 & 1) != 0) {
      this->cc_enable_arenas_ = from->cc_enable_arenas_;
    }
    if ((uVar1 >> 0x13 & 1) != 0) {
      this->optimize_for_ = from->optimize_for_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void FileOptions::MergeFrom(const FileOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_java_package(from._internal_java_package());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_java_outer_classname(from._internal_java_outer_classname());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_go_package(from._internal_go_package());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_set_objc_class_prefix(from._internal_objc_class_prefix());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_set_csharp_namespace(from._internal_csharp_namespace());
    }
    if (cached_has_bits & 0x00000020u) {
      _internal_set_swift_prefix(from._internal_swift_prefix());
    }
    if (cached_has_bits & 0x00000040u) {
      _internal_set_php_class_prefix(from._internal_php_class_prefix());
    }
    if (cached_has_bits & 0x00000080u) {
      _internal_set_php_namespace(from._internal_php_namespace());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _internal_set_php_metadata_namespace(from._internal_php_metadata_namespace());
    }
    if (cached_has_bits & 0x00000200u) {
      _internal_set_ruby_package(from._internal_ruby_package());
    }
    if (cached_has_bits & 0x00000400u) {
      java_multiple_files_ = from.java_multiple_files_;
    }
    if (cached_has_bits & 0x00000800u) {
      java_generate_equals_and_hash_ = from.java_generate_equals_and_hash_;
    }
    if (cached_has_bits & 0x00001000u) {
      java_string_check_utf8_ = from.java_string_check_utf8_;
    }
    if (cached_has_bits & 0x00002000u) {
      cc_generic_services_ = from.cc_generic_services_;
    }
    if (cached_has_bits & 0x00004000u) {
      java_generic_services_ = from.java_generic_services_;
    }
    if (cached_has_bits & 0x00008000u) {
      py_generic_services_ = from.py_generic_services_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x000f0000u) {
    if (cached_has_bits & 0x00010000u) {
      php_generic_services_ = from.php_generic_services_;
    }
    if (cached_has_bits & 0x00020000u) {
      deprecated_ = from.deprecated_;
    }
    if (cached_has_bits & 0x00040000u) {
      cc_enable_arenas_ = from.cc_enable_arenas_;
    }
    if (cached_has_bits & 0x00080000u) {
      optimize_for_ = from.optimize_for_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}